

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault_injection_test.cc
# Opt level: O3

Status __thiscall
leveldb::FaultInjectionTestEnv::NewAppendableFile
          (FaultInjectionTestEnv *this,string *fname,WritableFile **result)

{
  int iVar1;
  uint uVar2;
  mapped_type *pmVar3;
  TestWritableFile *this_00;
  undefined8 *in_RCX;
  string *psVar4;
  string *psVar5;
  WritableFile *actual_writable_file;
  FileState state;
  WritableFile *local_70;
  FileState local_68;
  
  (**(code **)(*(long *)fname->_M_string_length + 0x28))();
  if ((this->super_EnvWrapper).super_Env._vptr_Env != (_func_int **)0x0) {
    return (Status)(char *)this;
  }
  local_68.filename_._M_dataplus._M_p = (pointer)&local_68.filename_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,*result,
             (long)&(*result)->_vptr_WritableFile + (long)&result[1]->_vptr_WritableFile);
  local_68.pos_at_last_sync_ = -1;
  local_68.pos_at_last_flush_ = -1;
  local_68.pos_ = 0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&fname->field_2);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  psVar5 = (string *)fname[2]._M_string_length;
  if (psVar5 != (string *)0x0) {
    psVar4 = fname + 2;
    do {
      uVar2 = std::__cxx11::string::compare((string *)(psVar5 + 1));
      if (-1 < (int)uVar2) {
        psVar4 = psVar5;
      }
      psVar5 = *(string **)((long)&psVar5->field_2 + (ulong)(uVar2 >> 0x1f) * 8);
    } while (psVar5 != (string *)0x0);
    if ((psVar4 != fname + 2) &&
       (iVar1 = std::__cxx11::string::compare((string *)result), -1 < iVar1)) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState>_>_>
                             *)((long)&fname[1].field_2 + 8),(key_type *)result);
      std::__cxx11::string::_M_assign((string *)&local_68);
      local_68.pos_at_last_flush_ = pmVar3->pos_at_last_flush_;
      local_68.pos_ = pmVar3->pos_;
      local_68.pos_at_last_sync_ = pmVar3->pos_at_last_sync_;
      goto LAB_001078c6;
    }
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&fname[3]._M_string_length,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result);
LAB_001078c6:
  pthread_mutex_unlock((pthread_mutex_t *)&fname->field_2);
  this_00 = (TestWritableFile *)operator_new(0x58);
  TestWritableFile::TestWritableFile(this_00,&local_68,local_70,(FaultInjectionTestEnv *)fname);
  *in_RCX = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.filename_._M_dataplus._M_p != &local_68.filename_.field_2) {
    operator_delete(local_68.filename_._M_dataplus._M_p);
  }
  return (Status)(char *)this;
}

Assistant:

Status FaultInjectionTestEnv::NewAppendableFile(const std::string& fname,
                                                WritableFile** result) {
  WritableFile* actual_writable_file;
  Status s = target()->NewAppendableFile(fname, &actual_writable_file);
  if (s.ok()) {
    FileState state(fname);
    state.pos_ = 0;
    {
      MutexLock l(&mutex_);
      if (db_file_state_.count(fname) == 0) {
        new_files_since_last_dir_sync_.insert(fname);
      } else {
        state = db_file_state_[fname];
      }
    }
    *result = new TestWritableFile(state, actual_writable_file, this);
  }
  return s;
}